

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

void arkFree(void **arkode_mem)

{
  long *in_RDI;
  ARKodeMem ark_mem;
  ARKInterp in_stack_ffffffffffffffe8;
  void *arkode_mem_00;
  
  if (*in_RDI != 0) {
    arkode_mem_00 = (void *)*in_RDI;
    arkFreeVectors((ARKodeMem)0x1161690);
    if (*(long *)((long)arkode_mem_00 + 0x1b0) != 0) {
      free(*(void **)((long)arkode_mem_00 + 0x1b0));
      *(undefined8 *)((long)arkode_mem_00 + 0x1b0) = 0;
    }
    if (*(long *)((long)arkode_mem_00 + 0x148) != 0) {
      arkInterpFree(arkode_mem_00,in_stack_ffffffffffffffe8);
      *(undefined8 *)((long)arkode_mem_00 + 0x148) = 0;
    }
    if (*(long *)((long)arkode_mem_00 + 0x280) != 0) {
      arkRootFree(in_stack_ffffffffffffffe8);
      *(undefined8 *)((long)arkode_mem_00 + 0x280) = 0;
    }
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  return;
}

Assistant:

void arkFree(void **arkode_mem)
{
  ARKodeMem ark_mem;

  if (*arkode_mem == NULL) return;

  ark_mem = (ARKodeMem) (*arkode_mem);

  /* free vector storage */
  arkFreeVectors(ark_mem);

  /* free the time step adaptivity module */
  if (ark_mem->hadapt_mem != NULL) {
    free(ark_mem->hadapt_mem);
    ark_mem->hadapt_mem = NULL;
  }

  /* free the interpolation module */
  if (ark_mem->interp != NULL) {
    arkInterpFree(ark_mem, ark_mem->interp);
    ark_mem->interp = NULL;
  }

  /* free the root-finding module */
  if (ark_mem->root_mem != NULL) {
    (void) arkRootFree(*arkode_mem);
    ark_mem->root_mem = NULL;
  }

  free(*arkode_mem);
  *arkode_mem = NULL;
}